

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O0

uint32_t GET_32BIT_MSB_FIRST(void *vp)

{
  uint8_t *p;
  void *vp_local;
  
  return CONCAT13(*vp,CONCAT12(*(undefined1 *)((long)vp + 1),
                               CONCAT11(*(undefined1 *)((long)vp + 2),*(undefined1 *)((long)vp + 3))
                              ));
}

Assistant:

static inline uint32_t GET_32BIT_MSB_FIRST(const void *vp)
{
    const uint8_t *p = (const uint8_t *)vp;
    return (((uint32_t)p[3]      ) | ((uint32_t)p[2] <<  8) |
            ((uint32_t)p[1] << 16) | ((uint32_t)p[0] << 24));
}